

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

bool __thiscall Matrix::IsLowerTriangular(Matrix *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  bool local_5d;
  int local_5c;
  long local_58;
  long local_50;
  long local_48;
  Fraction local_38;
  
  local_5d = this->n_ < 1;
  if (0 < this->n_) {
    local_48 = 1;
    local_50 = 0x10;
    local_5c = 1;
    local_58 = 0;
    do {
      lVar1 = local_58 + 1;
      bVar4 = lVar1 < this->m_;
      if (lVar1 < this->m_) {
        lVar2 = *(long *)&(this->elements_).
                          super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_58].
                          super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                          super__Vector_impl_data;
        Fraction::Fraction(&local_38,0);
        bVar5 = operator!=((Fraction *)(local_48 * 8 + lVar2),&local_38);
        iVar6 = local_5c;
        lVar2 = local_50;
        while (!bVar5) {
          iVar6 = iVar6 + 1;
          bVar4 = iVar6 < this->m_;
          if (this->m_ <= iVar6) goto LAB_0010ba3a;
          lVar3 = *(long *)&(this->elements_).
                            super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_58].
                            super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                            super__Vector_impl_data;
          Fraction::Fraction(&local_38,0);
          bVar5 = operator!=((Fraction *)(lVar2 + lVar3),&local_38);
          lVar2 = lVar2 + 8;
        }
        if (bVar4) {
          return local_5d;
        }
      }
LAB_0010ba3a:
      local_48 = local_48 + 1;
      local_50 = local_50 + 8;
      local_5c = local_5c + 1;
      local_5d = this->n_ <= lVar1;
      local_58 = lVar1;
    } while (lVar1 < this->n_);
  }
  return local_5d;
}

Assistant:

bool Matrix::IsLowerTriangular() const {
  for (int row = 0; row < n_; ++row) {
    for (int column = row + 1; column < m_; ++column) {
      if (elements_[row][column] != 0) {
        return false;
      }
    }
  }

  return true;
}